

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * Fantasy_Character_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  byte bVar1;
  int32_t iVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  size_t n;
  void *struct_base;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char *mark;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong *puVar16;
  byte *buf_00;
  ulong *puVar17;
  int more;
  uint64_t value;
  int local_44;
  int32_t local_40;
  int local_3c;
  uint64_t local_38;
  
  *result = 0;
  switch(CONCAT71(in_register_00000009,type) & 0xffffffff) {
  case 0:
    if ((3 < (long)end - (long)buf) && (*(int *)buf == 0x6c6c756e)) {
      return buf + 4;
    }
    iVar3 = 0x1a;
    goto LAB_0011b83b;
  case 2:
    *result = 0;
    iVar3 = flatcc_builder_start_table(ctx->ctx,1);
    if (iVar3 == 0) {
      if ((buf == end) || (*buf != '{')) {
        local_44 = 0;
        buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
      }
      else {
        puVar16 = (ulong *)(buf + 1);
        if ((long)end - (long)puVar16 < 2) {
LAB_0011b929:
          puVar16 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar16,end);
        }
        else if ((char)(byte)*puVar16 < '!') {
          if (((byte)*puVar16 != 0x20) || (buf[2] < '!')) goto LAB_0011b929;
          puVar16 = (ulong *)(buf + 2);
        }
        if ((puVar16 == (ulong *)end) || ((byte)*puVar16 != 0x7d)) {
          local_44 = 1;
          buf = (char *)puVar16;
          do {
            if (buf != end) {
              if ((byte)*(ulong *)buf == 0x2e) {
                buf = flatcc_json_parser_set_error(ctx,buf,end,5);
              }
              else if ((byte)*(ulong *)buf == 0x22) {
                buf = (char *)((long)buf + 1);
                ctx->unquoted = 0;
              }
              else {
                ctx->unquoted = 1;
              }
            }
            puVar16 = (ulong *)buf;
            if ((ulong)((long)end - (long)buf) < 8) {
              uVar9 = 0;
              uVar7 = 0;
              uVar11 = 0;
              uVar13 = 0;
              uVar14 = 0;
              uVar6 = 0;
              switch((long)end - (long)buf) {
              case 7:
                uVar9 = (long)(char)*(byte *)((long)buf + 6) << 8;
              case 6:
                uVar7 = (long)(char)*(byte *)((long)buf + 5) << 0x10 | uVar9;
              case 5:
                uVar11 = (long)(char)*(byte *)((long)buf + 4) << 0x18 | uVar7;
              case 4:
                uVar13 = (long)(char)*(byte *)((long)buf + 3) << 0x20 | uVar11;
              case 3:
                uVar14 = (long)(char)*(byte *)((long)buf + 2) << 0x28 | uVar13;
              case 2:
                uVar6 = (long)(char)*(byte *)((long)buf + 1) << 0x30 | uVar14;
              case 1:
                uVar6 = (ulong)(byte)*(ulong *)buf << 0x38 | uVar6;
                goto LAB_0011ba5c;
              }
switchD_0011bab0_default:
              buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar16,end);
            }
            else {
              uVar7 = *(ulong *)buf;
              uVar6 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
LAB_0011ba5c:
              if (uVar6 != 0x73776f72645f6174) goto switchD_0011bab0_default;
              puVar16 = (ulong *)((long)buf + 8);
              if ((ulong)((long)end - (long)puVar16) < 8) {
                uVar9 = 0;
                uVar7 = 0;
                uVar11 = 0;
                uVar13 = 0;
                uVar14 = 0;
                uVar6 = 0;
                switch((long)end - (long)puVar16) {
                case 7:
                  uVar9 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
                case 6:
                  uVar7 = (long)(char)*(byte *)((long)buf + 0xd) << 0x10 | uVar9;
                case 5:
                  uVar11 = (long)(char)*(byte *)((long)buf + 0xc) << 0x18 | uVar7;
                case 4:
                  uVar13 = (long)(char)*(byte *)((long)buf + 0xb) << 0x20 | uVar11;
                case 3:
                  uVar14 = (long)(char)*(byte *)((long)buf + 10) << 0x28 | uVar13;
                case 2:
                  uVar6 = (long)(char)*(byte *)((long)buf + 9) << 0x30 | uVar14;
                case 1:
                  uVar6 = (ulong)(byte)*puVar16 << 0x38 | uVar6;
                  break;
                default:
                  goto switchD_0011bab0_default;
                }
              }
              else {
                uVar7 = *puVar16;
                uVar6 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                        (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                        (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                        (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              }
              if (uVar6 != 0x7461636b5f64616d) goto switchD_0011bab0_default;
              puVar16 = (ulong *)((long)buf + 0x10);
              uVar7 = (long)end - (long)puVar16;
              puVar17 = puVar16;
              if (uVar7 < 8) {
                uVar12 = 0;
                uVar15 = 0;
                uVar10 = 0;
                switch(uVar7) {
                case 7:
                case 6:
                case 5:
                case 4:
                  uVar12 = (uint)(char)*(byte *)((long)buf + 0x13);
                case 3:
                  uVar15 = (uint)((ulong)((long)(char)*(byte *)((long)buf + 0x12) << 0x28) >> 0x20)
                           | uVar12;
                case 2:
                  uVar10 = (uint)((ulong)((long)(char)*(byte *)((long)buf + 0x11) << 0x30) >> 0x20)
                           | uVar15;
                case 1:
                  uVar10 = (uint)(((ulong)(byte)*puVar16 << 0x38) >> 0x20) | uVar10;
                  goto LAB_0011bbbd;
                }
switchD_0011bb6a_default:
                buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar17,end);
              }
              else {
                uVar6 = *puVar16;
                uVar10 = (uint)(uVar6 >> 8) & 0xff00 | (uint)(((uVar6 & 0xff00) << 0x28) >> 0x20) |
                         (uint)((uVar6 << 0x38) >> 0x20);
LAB_0011bbbd:
                if ((uVar10 >> 8 != 0x616765) || ((long)uVar7 < 4)) goto switchD_0011bb6a_default;
                bVar1 = *(byte *)((long)buf + 0x13);
                if (ctx->unquoted == 0) {
                  if (bVar1 == 0x22) {
                    buf_00 = (byte *)((long)buf + 0x14);
                    goto LAB_0011bc0e;
                  }
                  goto switchD_0011bb6a_default;
                }
                if (' ' < (char)bVar1 && bVar1 != 0x3a) goto switchD_0011bb6a_default;
                buf_00 = (byte *)((long)buf + 0x13);
                ctx->unquoted = 0;
LAB_0011bc0e:
                if ((long)end - (long)buf_00 < 2) {
LAB_0011bc2f:
                  buf_00 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
                }
                else if ((char)*buf_00 < '!') {
                  if ((*buf_00 != 0x20) || ((char)buf_00[1] < '!')) goto LAB_0011bc2f;
                  buf_00 = buf_00 + 1;
                }
                if ((buf_00 == (byte *)end) || (*buf_00 != 0x3a)) {
                  puVar17 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_00,end,4);
                }
                else {
                  puVar17 = (ulong *)(buf_00 + 1);
                  if ((long)end - (long)puVar17 < 2) {
LAB_0011bc8a:
                    puVar17 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar17,end);
                  }
                  else if ((char)(byte)*puVar17 < '!') {
                    if (((byte)*puVar17 != 0x20) || ((char)buf_00[2] < '!')) goto LAB_0011bc8a;
                    puVar17 = (ulong *)(buf_00 + 2);
                  }
                }
                if (puVar16 == puVar17) goto switchD_0011bb6a_default;
                local_38 = 0;
                local_3c = 0;
                local_40 = 0;
                buf = (char *)puVar17;
                if ((puVar17 != (ulong *)end) &&
                   (buf = flatcc_json_parser_integer(ctx,(char *)puVar17,end,&local_3c,&local_38),
                   (ulong *)buf != puVar17)) {
                  if (local_3c == 0) {
                    uVar7 = local_38;
                    if (local_38 >> 0x1f == 0) goto LAB_0011bd74;
                    iVar3 = 7;
                  }
                  else {
                    if (local_38 < 0x80000001) {
                      uVar7 = -local_38;
LAB_0011bd74:
                      local_40 = (int32_t)uVar7;
                      goto LAB_0011bd78;
                    }
                    iVar3 = 8;
                  }
                  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                }
LAB_0011bd78:
                if ((puVar17 == (ulong *)buf) &&
                   ((buf = flatcc_json_parser_symbolic_int32
                                     (ctx,buf,end,
                                      (flatcc_json_parser_integral_symbol_f **)
                                      Fantasy_Attacker_parse_json_table_symbolic_parsers,&local_40),
                    (ulong *)buf == puVar17 || (buf == end)))) goto LAB_0011b8d9;
                iVar2 = local_40;
                if ((local_40 != 0) || ((ctx->flags & 2) != 0)) {
                  piVar8 = (int *)flatcc_builder_table_add(ctx->ctx,0,4,4);
                  if (piVar8 == (int *)0x0) goto LAB_0011b8d9;
                  *piVar8 = iVar2;
                }
              }
            }
            buf = flatcc_json_parser_object_end(ctx,buf,end,&local_44);
          } while (local_44 != 0);
        }
        else {
          local_44 = 0;
          buf = (char *)((long)puVar16 + 1);
          if ((long)end - (long)buf < 2) {
LAB_0011be01:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar16 + 2) < '!')) goto LAB_0011be01;
            buf = (char *)((long)puVar16 + 2);
          }
        }
      }
      if (ctx->error == 0) {
        fVar4 = flatcc_builder_end_table(ctx->ctx);
        *result = fVar4;
        if (fVar4 != 0) break;
      }
    }
LAB_0011b8d9:
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    break;
  case 8:
    struct_base = flatcc_builder_start_struct(ctx->ctx,8,4);
    if ((struct_base != (void *)0x0) &&
       (buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx,buf,end,struct_base), ctx->error == 0))
    {
      fVar4 = flatcc_builder_end_struct(ctx->ctx);
      *result = fVar4;
      if (fVar4 != 0) break;
    }
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    break;
  case 9:
  case 10:
    buf = Fantasy_BookReader_parse_json_struct(ctx,buf,end,result);
    break;
  case 0xb:
switchD_0011b71a_caseD_b:
    buf = flatcc_json_parser_build_string(ctx,buf,end,result);
    break;
  default:
    if ((int)CONCAT71(in_register_00000009,type) == 0xff) goto switchD_0011b71a_caseD_b;
  case 1:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    if ((ctx->flags & 1) != 0) {
      pcVar5 = flatcc_json_parser_generic_json(ctx,buf,end);
      return pcVar5;
    }
    iVar3 = 0xf;
LAB_0011b83b:
    pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
    return pcVar5;
  }
  if ((ctx->error == 0) && (*result == 0)) {
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  }
  return (char *)(ulong *)buf;
}

Assistant:

static const char *Fantasy_Character_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 2: /* MuLan */
        buf = Fantasy_Attacker_parse_json_table(ctx, buf, end, result);
        break;
    case 8: /* Rapunzel */
        buf = Fantasy_Rapunzel_parse_json_struct(ctx, buf, end, result);
        break;
    case 9: /* Belle */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 10: /* BookFan */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 11: /* Other */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    case 255: /* Unused */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}